

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

string * __thiscall
PacketReader::GetFixedString_abi_cxx11_
          (string *__return_storage_ptr__,PacketReader *this,size_t length)

{
  if ((this->data)._M_string_length - this->pos < length) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
    this->pos = this->pos + __return_storage_ptr__->_M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PacketReader::GetFixedString(std::size_t length)
{
	if (this->Remaining() < length)
		return "";

	std::string ret = this->data.substr(this->pos, length);
	this->pos += ret.length();

	return ret;
}